

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O2

int md_process_table_row
              (MD_CTX *ctx,MD_BLOCKTYPE cell_type,MD_OFFSET beg,MD_OFFSET end,MD_ALIGN *align,
              int col_count)

{
  MD_ALIGN *pMVar1;
  MD_MARK *pMVar2;
  int iVar3;
  MD_OFFSET *__ptr;
  ulong uVar4;
  _func_void_char_ptr_void_ptr *p_Var5;
  long lVar6;
  ulong uVar8;
  uint uVar9;
  void *pvVar10;
  char *pcVar11;
  ulong uVar12;
  uint beg_00;
  MD_LINE line;
  int *piVar7;
  
  line.beg = beg;
  line.end = end;
  iVar3 = md_analyze_inlines(ctx,&line,1,1);
  if (-1 < iVar3) {
    __ptr = (MD_OFFSET *)malloc((long)ctx->n_table_cell_boundaries * 4 + 8);
    if (__ptr != (MD_OFFSET *)0x0) {
      *__ptr = beg;
      uVar4 = 1;
      piVar7 = &ctx->table_cell_boundaries_head;
      while (lVar6 = (long)*piVar7, -1 < lVar6) {
        pMVar2 = ctx->marks;
        __ptr[uVar4] = pMVar2[lVar6].end;
        uVar4 = uVar4 + 1;
        piVar7 = &pMVar2[lVar6].next;
      }
      __ptr[uVar4 & 0xffffffff] = end + 1;
      uVar9 = 0;
      iVar3 = (*(ctx->parser).enter_block)(MD_BLOCK_TR,(void *)0x0,ctx->userdata);
      if (iVar3 == 0) {
        uVar12 = 0;
        do {
          do {
            beg_00 = beg;
            uVar8 = (ulong)uVar9;
            if (((uVar4 & 0xffffffff) <= uVar12) || (col_count <= (int)uVar9)) {
              goto LAB_001066e9;
            }
            beg = __ptr[uVar12 + 1];
            uVar12 = uVar12 + 1;
          } while (beg - 1 <= beg_00);
          uVar9 = uVar9 + 1;
          iVar3 = md_process_table_cell(ctx,cell_type,align[uVar8],beg_00,beg - 1);
        } while (-1 < iVar3);
      }
      else {
        p_Var5 = (ctx->parser).debug_log;
        if (p_Var5 != (_func_void_char_ptr_void_ptr *)0x0) {
          pvVar10 = ctx->userdata;
          pcVar11 = "Aborted from enter_block() callback.";
LAB_0010663c:
          (*p_Var5)(pcVar11,pvVar10);
        }
      }
      goto LAB_00106662;
    }
    p_Var5 = (ctx->parser).debug_log;
    iVar3 = -1;
    if (p_Var5 != (_func_void_char_ptr_void_ptr *)0x0) {
      (*p_Var5)("malloc() failed.",ctx->userdata);
    }
  }
  __ptr = (MD_OFFSET *)0x0;
  goto LAB_00106662;
  while( true ) {
    pMVar1 = align + uVar8;
    uVar8 = uVar8 + 1;
    iVar3 = md_process_table_cell(ctx,cell_type,*pMVar1,0,0);
    if (iVar3 < 0) break;
LAB_001066e9:
    if ((long)col_count <= (long)uVar8) {
      iVar3 = (*(ctx->parser).leave_block)(MD_BLOCK_TR,(void *)0x0,ctx->userdata);
      if (iVar3 == 0) {
        iVar3 = 0;
      }
      else {
        p_Var5 = (ctx->parser).debug_log;
        if (p_Var5 != (_func_void_char_ptr_void_ptr *)0x0) {
          pvVar10 = ctx->userdata;
          pcVar11 = "Aborted from leave_block() callback.";
          goto LAB_0010663c;
        }
      }
      break;
    }
  }
LAB_00106662:
  free(__ptr);
  ctx->table_cell_boundaries_head = -1;
  ctx->table_cell_boundaries_tail = -1;
  return iVar3;
}

Assistant:

static int
md_process_table_row(MD_CTX* ctx, MD_BLOCKTYPE cell_type, OFF beg, OFF end,
                     const MD_ALIGN* align, int col_count)
{
    MD_LINE line;
    OFF* pipe_offs = NULL;
    int i, j, k, n;
    int ret = 0;

    line.beg = beg;
    line.end = end;

    /* Break the line into table cells by identifying pipe characters who
     * form the cell boundary. */
    MD_CHECK(md_analyze_inlines(ctx, &line, 1, TRUE));

    /* We have to remember the cell boundaries in local buffer because
     * ctx->marks[] shall be reused during cell contents processing. */
    n = ctx->n_table_cell_boundaries + 2;
    pipe_offs = (OFF*) malloc(n * sizeof(OFF));
    if(pipe_offs == NULL) {
        MD_LOG("malloc() failed.");
        ret = -1;
        goto abort;
    }
    j = 0;
    pipe_offs[j++] = beg;
    for(i = ctx->table_cell_boundaries_head; i >= 0; i = ctx->marks[i].next) {
        MD_MARK* mark = &ctx->marks[i];
        pipe_offs[j++] = mark->end;
    }
    pipe_offs[j++] = end+1;

    /* Process cells. */
    MD_ENTER_BLOCK(MD_BLOCK_TR, NULL);
    k = 0;
    for(i = 0; i < j-1  &&  k < col_count; i++) {
        if(pipe_offs[i] < pipe_offs[i+1]-1)
            MD_CHECK(md_process_table_cell(ctx, cell_type, align[k++], pipe_offs[i], pipe_offs[i+1]-1));
    }
    /* Make sure we call enough table cells even if the current table contains
     * too few of them. */
    while(k < col_count)
        MD_CHECK(md_process_table_cell(ctx, cell_type, align[k++], 0, 0));
    MD_LEAVE_BLOCK(MD_BLOCK_TR, NULL);

abort:
    free(pipe_offs);

    ctx->table_cell_boundaries_head = -1;
    ctx->table_cell_boundaries_tail = -1;

    return ret;
}